

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O0

int add(svm_params *params,svm_example *fec)

{
  long *plVar1;
  size_t sVar2;
  long in_RDI;
  svm_model *model;
  svm_example **in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint uVar3;
  
  plVar1 = *(long **)(in_RDI + 0x38);
  *plVar1 = *plVar1 + 1;
  v_array<svm_example_*>::push_back
            ((v_array<svm_example_*> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
             ,in_stack_ffffffffffffffd8);
  uVar3 = 0;
  v_array<float>::push_back
            ((v_array<float> *)(ulong)in_stack_ffffffffffffffe0,(float *)in_stack_ffffffffffffffd8);
  v_array<float>::push_back
            ((v_array<float> *)((ulong)uVar3 << 0x20),(float *)in_stack_ffffffffffffffd8);
  sVar2 = v_array<svm_example_*>::size((v_array<svm_example_*> *)(plVar1 + 1));
  return (int)sVar2 + -1;
}

Assistant:

int add(svm_params& params, svm_example* fec)
{
  svm_model* model = params.model;
  model->num_support++;
  model->support_vec.push_back(fec);
  model->alpha.push_back(0.);
  model->delta.push_back(0.);
  // cout<<"After adding "<<model->num_support<<endl;
  return (int)(model->support_vec.size() - 1);
}